

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.pb.cc
# Opt level: O3

void google::protobuf::Any::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  Arena *pAVar2;
  Arena *extraout_RDX;
  string *psVar3;
  MessageLite *this;
  
  if (from_msg == to_msg) {
    psVar3 = (string *)to_msg;
    this = from_msg;
    MergeImpl();
    pAVar2 = extraout_RDX;
LAB_001be7eb:
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
  }
  else {
    psVar3 = (string *)((ulong)from_msg[1]._vptr_MessageLite & 0xfffffffffffffffc);
    if (psVar3->_M_string_length == 0) goto LAB_001be78d;
    this = to_msg + 1;
    pAVar2 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar2 & 1) != 0) goto LAB_001be7eb;
  }
  internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,psVar3,pAVar2);
LAB_001be78d:
  psVar3 = (string *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
  if (psVar3->_M_string_length != 0) {
    pAVar2 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar2 & 1) != 0) {
      pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>((ArenaStringPtr *)&to_msg[1]._internal_metadata_,psVar3,pAVar2);
  }
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void Any::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Any*>(&to_msg);
  auto& from = static_cast<const Any&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Any)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_type_url().empty()) {
    _this->_internal_set_type_url(from._internal_type_url());
  }
  if (!from._internal_value().empty()) {
    _this->_internal_set_value(from._internal_value());
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}